

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void detectEWMH(void)

{
  unsigned_long uVar1;
  unsigned_long atomCount;
  Atom *supportedAtoms;
  Atom wmSupported;
  Atom supportingWmCheck;
  Window *windowFromChild;
  Window *windowFromRoot;
  
  windowFromChild = (Window *)0x0;
  supportingWmCheck = 0;
  wmSupported = XInternAtom(_glfw.x11.display,"_NET_SUPPORTING_WM_CHECK",0);
  supportedAtoms = (Atom *)XInternAtom(_glfw.x11.display,"_NET_SUPPORTED",0);
  uVar1 = _glfwGetWindowPropertyX11(_glfw.x11.root,wmSupported,0x21,(uchar **)&windowFromChild);
  if (uVar1 == 1) {
    _glfwGrabErrorHandlerX11();
    uVar1 = _glfwGetWindowPropertyX11
                      (*windowFromChild,wmSupported,0x21,(uchar **)&supportingWmCheck);
    if (uVar1 == 1) {
      _glfwReleaseErrorHandlerX11();
      if (*windowFromChild == *(Window *)supportingWmCheck) {
        XFree(windowFromChild);
        XFree(supportingWmCheck);
        uVar1 = _glfwGetWindowPropertyX11
                          (_glfw.x11.root,(Atom)supportedAtoms,4,(uchar **)&atomCount);
        _glfw.x11.NET_WM_STATE = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE");
        _glfw.x11.NET_WM_STATE_ABOVE =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_ABOVE");
        _glfw.x11.NET_WM_STATE_FULLSCREEN =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_FULLSCREEN");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_VERT");
        _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_STATE_MAXIMIZED_HORZ");
        _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_FULLSCREEN_MONITORS");
        _glfw.x11.NET_WM_WINDOW_TYPE =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE");
        _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_WM_WINDOW_TYPE_NORMAL");
        _glfw.x11.NET_ACTIVE_WINDOW = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_ACTIVE_WINDOW")
        ;
        _glfw.x11.NET_FRAME_EXTENTS = getSupportedAtom((Atom *)atomCount,uVar1,"_NET_FRAME_EXTENTS")
        ;
        _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
             getSupportedAtom((Atom *)atomCount,uVar1,"_NET_REQUEST_FRAME_EXTENTS");
        XFree(atomCount);
      }
      else {
        XFree(windowFromChild);
        XFree(supportingWmCheck);
      }
    }
    else {
      XFree(windowFromChild);
      if (supportingWmCheck != 0) {
        XFree(supportingWmCheck);
      }
    }
  }
  else if (windowFromChild != (Window *)0x0) {
    XFree(windowFromChild);
  }
  return;
}

Assistant:

static void detectEWMH(void)
{
    Window* windowFromRoot = NULL;
    Window* windowFromChild = NULL;

    // First we need a couple of atoms
    const Atom supportingWmCheck =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTING_WM_CHECK", False);
    const Atom wmSupported =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTED", False);

    // Then we look for the _NET_SUPPORTING_WM_CHECK property of the root window
    if (_glfwGetWindowPropertyX11(_glfw.x11.root,
                                  supportingWmCheck,
                                  XA_WINDOW,
                                  (unsigned char**) &windowFromRoot) != 1)
    {
        if (windowFromRoot)
            XFree(windowFromRoot);
        return;
    }

    _glfwGrabErrorHandlerX11();

    // It should be the ID of a child window (of the root)
    // Then we look for the same property on the child window
    if (_glfwGetWindowPropertyX11(*windowFromRoot,
                                  supportingWmCheck,
                                  XA_WINDOW,
                                  (unsigned char**) &windowFromChild) != 1)
    {
        XFree(windowFromRoot);
        if (windowFromChild)
            XFree(windowFromChild);
        return;
    }

    _glfwReleaseErrorHandlerX11();

    // It should be the ID of that same child window
    if (*windowFromRoot != *windowFromChild)
    {
        XFree(windowFromRoot);
        XFree(windowFromChild);
        return;
    }

    XFree(windowFromRoot);
    XFree(windowFromChild);

    // We are now fairly sure that an EWMH-compliant window manager is running

    Atom* supportedAtoms;
    unsigned long atomCount;

    // Now we need to check the _NET_SUPPORTED property of the root window
    // It should be a list of supported WM protocol and state atoms
    atomCount = _glfwGetWindowPropertyX11(_glfw.x11.root,
                                          wmSupported,
                                          XA_ATOM,
                                          (unsigned char**) &supportedAtoms);

    // See which of the atoms we support that are supported by the WM
    _glfw.x11.NET_WM_STATE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE");
    _glfw.x11.NET_WM_STATE_ABOVE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_ABOVE");
    _glfw.x11.NET_WM_STATE_FULLSCREEN =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_FULLSCREEN");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_VERT");
    _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_STATE_MAXIMIZED_HORZ");
    _glfw.x11.NET_WM_FULLSCREEN_MONITORS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_FULLSCREEN_MONITORS");
    _glfw.x11.NET_WM_WINDOW_TYPE =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE");
    _glfw.x11.NET_WM_WINDOW_TYPE_NORMAL =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_WM_WINDOW_TYPE_NORMAL");
    _glfw.x11.NET_ACTIVE_WINDOW =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_ACTIVE_WINDOW");
    _glfw.x11.NET_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_FRAME_EXTENTS");
    _glfw.x11.NET_REQUEST_FRAME_EXTENTS =
        getSupportedAtom(supportedAtoms, atomCount, "_NET_REQUEST_FRAME_EXTENTS");

    XFree(supportedAtoms);
}